

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.h
# Opt level: O0

void __thiscall cmMakefile::AddInstallGenerator(cmMakefile *this,cmInstallGenerator *g)

{
  cmInstallGenerator *local_18;
  cmInstallGenerator *g_local;
  cmMakefile *this_local;
  
  if (g != (cmInstallGenerator *)0x0) {
    local_18 = g;
    g_local = (cmInstallGenerator *)this;
    std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::push_back
              (&this->InstallGenerators,&local_18);
  }
  return;
}

Assistant:

void AddInstallGenerator(cmInstallGenerator* g)
  {
    if (g) {
      this->InstallGenerators.push_back(g);
    }
  }